

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void NOPLL_Write(opll_t *chip,uint32_t port,uint8_t data)

{
  uint8_t data_local;
  uint32_t port_local;
  opll_t *chip_local;
  
  chip->write_data = data;
  if ((port & 1) == 0) {
    chip->write_a = chip->write_a | 1;
  }
  else {
    chip->write_d = chip->write_d | 1;
  }
  return;
}

Assistant:

void NOPLL_Write(opll_t *chip, uint32_t port, uint8_t data) {
    chip->write_data = data;
    if (port & 1) {
        /* Data */
        chip->write_d |= 1;
    } else {
        /* Address */
        chip->write_a |= 1;
    }
}